

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcp251xfd-dump.c
# Opt level: O0

char * mcp251xfd_dump_ring_obj_one_fifo_flags_ring(mcp251xfd_priv *priv,mcp251xfd_ring *ring,u8 n)

{
  u8 uVar1;
  u8 uVar2;
  u8 in_DL;
  mcp251xfd_ring *in_RSI;
  mcp251xfd_priv *in_RDI;
  
  if (((in_RSI->head != 0xffffffff) && (in_RSI->tail != 0xffffffff)) &&
     (uVar1 = mcp251xfd_dump_get_ring_tail(in_RDI,in_RSI), uVar1 == in_DL)) {
    uVar1 = mcp251xfd_dump_get_ring_head(in_RDI,in_RSI);
    uVar2 = mcp251xfd_dump_get_ring_tail(in_RDI,in_RSI);
    if (uVar1 == uVar2) {
      if (in_RSI->head == in_RSI->tail) {
        return "  ring-FIFO-empty";
      }
      return "  ring-FIFO-full";
    }
  }
  return "";
}

Assistant:

static const char *
mcp251xfd_dump_ring_obj_one_fifo_flags_ring(const struct mcp251xfd_priv *priv,
					    const struct mcp251xfd_ring *ring,
					    const u8 n)
{
	if (ring->head == MCP251XFD_DUMP_UNKNOWN ||
	    ring->tail == MCP251XFD_DUMP_UNKNOWN ||
	    mcp251xfd_dump_get_ring_tail(priv, ring) != n ||
	    mcp251xfd_dump_get_ring_head(priv, ring) != mcp251xfd_dump_get_ring_tail(priv, ring))
		return "";

	if (ring->head == ring->tail)
		return "  ring-FIFO-empty";
	else
		return "  ring-FIFO-full";

	return "";
}